

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O2

_Bool trans_PKH(DisasContext_conflict1 *s,arg_PKH *a)

{
  int arg2;
  TCGContext_conflict1 *tcg_ctx;
  ulong uVar1;
  _Bool _Var2;
  TCGv_i32 ret;
  TCGv_i32 ret_00;
  int32_t arg2_00;
  TCGv_i32 arg2_01;
  TCGv_i32 arg1;
  
  tcg_ctx = s->uc->tcg_ctx;
  arg2 = a->imm;
  if (s->thumb == 0) {
    uVar1 = s->features & 8;
  }
  else {
    uVar1 = s->features >> 0x22 & 1;
  }
  if (uVar1 == 0) {
    _Var2 = false;
  }
  else {
    ret = load_reg(s,a->rn);
    ret_00 = load_reg(s,a->rm);
    if (a->tb == 0) {
      tcg_gen_shli_i32_aarch64(tcg_ctx,ret_00,ret_00,arg2);
      arg2_01 = ret;
      arg1 = ret_00;
    }
    else {
      arg2_00 = 0x1f;
      if (arg2 != 0) {
        arg2_00 = arg2;
      }
      tcg_gen_sari_i32_aarch64(tcg_ctx,ret_00,ret_00,arg2_00);
      arg2_01 = ret_00;
      arg1 = ret;
    }
    tcg_gen_deposit_i32_aarch64(tcg_ctx,ret,arg1,arg2_01,0,0x10);
    tcg_temp_free_internal_aarch64(tcg_ctx,(TCGTemp *)(ret_00 + (long)tcg_ctx));
    store_reg(s,a->rd,ret);
    _Var2 = true;
  }
  return _Var2;
}

Assistant:

static bool trans_PKH(DisasContext *s, arg_PKH *a)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    TCGv_i32 tn, tm;
    int shift = a->imm;

    if (s->thumb
        ? !arm_dc_feature(s, ARM_FEATURE_THUMB_DSP)
        : !ENABLE_ARCH_6) {
        return false;
    }

    tn = load_reg(s, a->rn);
    tm = load_reg(s, a->rm);
    if (a->tb) {
        /* PKHTB */
        if (shift == 0) {
            shift = 31;
        }
        tcg_gen_sari_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tn, tm, 0, 16);
    } else {
        /* PKHBT */
        tcg_gen_shli_i32(tcg_ctx, tm, tm, shift);
        tcg_gen_deposit_i32(tcg_ctx, tn, tm, tn, 0, 16);
    }
    tcg_temp_free_i32(tcg_ctx, tm);
    store_reg(s, a->rd, tn);
    return true;
}